

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2cp.c
# Opt level: O3

_Bool i2cp_ringbuf_flush(i2cp_ringbuf *b,i2cp_buffer_visitor v,i2cp_state *st)

{
  uint8_t *puVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  bool bVar5;
  
  uVar2 = b->sz;
  if (uVar2 != 0) {
    uVar4 = b->idx;
    uVar3 = uVar2;
    do {
      bVar5 = uVar4 == 0;
      uVar4 = uVar4 - 1;
      if (bVar5) {
        uVar4 = 0x1f;
      }
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
    do {
      puVar1 = b->buffs[0].buf + (ulong)uVar4 * 0x10000 + (ulong)uVar4 * 4 + -4;
      (*v)(puVar1 + 4,*(uint32_t *)puVar1,st);
      uVar4 = uVar4 + 1 & 0x1f;
      b->sz = b->sz - 1;
    } while (b->sz != 0);
  }
  return uVar2 != 0;
}

Assistant:

bool i2cp_ringbuf_flush(struct i2cp_ringbuf * b, i2cp_buffer_visitor v, struct i2cp_state * st)
{
  if(b->sz == 0) return false;
  struct i2cp_msgbuf * msg;
  uint16_t sz = b->sz;
  uint16_t idx = b->idx;
  while(sz)
  {
    if(idx)
      idx = idx - 1;
    else
      idx = RINGBUF_SZ - 1;
    sz--; 
  }
  while(b->sz)
  {
    msg = &b->buffs[idx];
    v(msg->buf, msg->sz, st);
    idx = (idx + 1) % RINGBUF_SZ;
    b->sz --;
  }
  return true;
}